

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::RepeatedStringFieldGenerator::GenerateBuilderMembers
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.LazyStringList $name$_ = $empty_list$;\n");
  io::Printer::Print(printer,variables,
                     "private void ensure$capitalized_name$IsMutable() {\n  if (!$get_mutable_bit_builder$) {\n    $name$_ = new com.google.protobuf.LazyStringArrayList($name$_);\n    $set_mutable_bit_builder$;\n   }\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.util.List<java.lang.String>\n    get$capitalized_name$List() {\n  return java.util.Collections.unmodifiableList($name$_);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public int get$capitalized_name$Count() {\n  return $name$_.size();\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public java.lang.String get$capitalized_name$(int index) {\n  return $name$_.get(index);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public com.google.protobuf.ByteString\n    get$capitalized_name$Bytes(int index) {\n  return $name$_.getByteString(index);\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder set$capitalized_name$(\n    int index, java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.set(index, value);\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder add$capitalized_name$(\n    java.lang.String value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder addAll$capitalized_name$(\n    java.lang.Iterable<java.lang.String> values) {\n  ensure$capitalized_name$IsMutable();\n  super.addAll(values, $name$_);\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder clear$capitalized_name$() {\n  $name$_ = $empty_list$;\n  $clear_mutable_bit_builder$;\n  $on_changed$\n  return this;\n}\n"
                    );
  WriteFieldDocComment(printer,this->descriptor_);
  io::Printer::Print(printer,variables,
                     "$deprecation$public Builder add$capitalized_name$Bytes(\n    com.google.protobuf.ByteString value) {\n$null_check$  ensure$capitalized_name$IsMutable();\n  $name$_.add(value);\n  $on_changed$\n  return this;\n}\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateBuilderMembers(io::Printer* printer) const {
  // One field is the list and the bit field keeps track of whether the
  // list is immutable. If it's immutable, the invariant is that it must
  // either an instance of Collections.emptyList() or it's an ArrayList
  // wrapped in a Collections.unmodifiableList() wrapper and nobody else has
  // a refererence to the underlying ArrayList. This invariant allows us to
  // share instances of lists between protocol buffers avoiding expensive
  // memory allocations. Note, immutable is a strong guarantee here -- not
  // just that the list cannot be modified via the reference but that the
  // list can never be modified.
  printer->Print(variables_,
    "private com.google.protobuf.LazyStringList $name$_ = $empty_list$;\n");

  printer->Print(variables_,
    "private void ensure$capitalized_name$IsMutable() {\n"
    "  if (!$get_mutable_bit_builder$) {\n"
    "    $name$_ = new com.google.protobuf.LazyStringArrayList($name$_);\n"
    "    $set_mutable_bit_builder$;\n"
    "   }\n"
    "}\n");

    // Note:  We return an unmodifiable list because otherwise the caller
    //   could hold on to the returned list and modify it after the message
    //   has been built, thus mutating the message which is supposed to be
    //   immutable.
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.util.List<java.lang.String>\n"
    "    get$capitalized_name$List() {\n"
    "  return java.util.Collections.unmodifiableList($name$_);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public int get$capitalized_name$Count() {\n"
    "  return $name$_.size();\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public java.lang.String get$capitalized_name$(int index) {\n"
    "  return $name$_.get(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public com.google.protobuf.ByteString\n"
    "    get$capitalized_name$Bytes(int index) {\n"
    "  return $name$_.getByteString(index);\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder set$capitalized_name$(\n"
    "    int index, java.lang.String value) {\n"
    "$null_check$"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.set(index, value);\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$(\n"
    "    java.lang.String value) {\n"
    "$null_check$"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(value);\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder addAll$capitalized_name$(\n"
    "    java.lang.Iterable<java.lang.String> values) {\n"
    "  ensure$capitalized_name$IsMutable();\n"
    "  super.addAll(values, $name$_);\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder clear$capitalized_name$() {\n"
    "  $name$_ = $empty_list$;\n"
    "  $clear_mutable_bit_builder$;\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public Builder add$capitalized_name$Bytes(\n"
    "    com.google.protobuf.ByteString value) {\n"
    "$null_check$"
    "  ensure$capitalized_name$IsMutable();\n"
    "  $name$_.add(value);\n"
    "  $on_changed$\n"
    "  return this;\n"
    "}\n");
}